

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
ft::vector<int,_ft::allocator<int>_>::insert
          (vector<int,_ft::allocator<int>_> *this,iterator position,size_type n,
          value_type_conflict *val)

{
  value_type_conflict *__dest;
  size_type sVar1;
  iterator piVar2;
  value_type_conflict *val_00;
  iterator piVar3;
  size_t __n;
  
  piVar3 = this->m_data + this->m_size;
  __dest = (value_type_conflict *)operator_new((long)piVar3 - (long)position);
  __n = (long)piVar3 - (long)position;
  if (__n != 0) {
    memcpy(__dest,position,__n);
  }
  sVar1 = this->m_size;
  piVar2 = this->m_data + sVar1;
  if (piVar2 != position) {
    do {
      sVar1 = sVar1 - 1;
      piVar2 = piVar2 + -1;
    } while (piVar2 != position);
    this->m_size = sVar1;
  }
  if (n != 0) {
    do {
      push_back(this,val);
      n = n - 1;
    } while (n != 0);
  }
  val_00 = __dest;
  if (piVar3 != position) {
    do {
      push_back(this,val_00);
      __n = __n - 4;
      val_00 = val_00 + 1;
    } while (__n != 0);
  }
  operator_delete(__dest);
  return;
}

Assistant:

void        insert(iterator position, size_type n, value_type const & val) {
		vector	tmp(position, this->end());
		while (position != this->end())
			this->pop_back();
		for (size_type i = 0; i < n; ++i)
			this->push_back(val);
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
	}